

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sv.c
# Opt level: O2

int checkscript(void)

{
  int iVar1;
  __pid_t pid;
  int *piVar2;
  char *pcVar3;
  char *prog [2];
  stat s;
  
  iVar1 = stat("check",(stat *)&s);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    if (*piVar2 == error_noent) {
      return 1;
    }
    outs2("warning: ");
    outs2("unable to stat ");
    outs2(*service);
    outs2("/check: ");
    iVar1 = *piVar2;
  }
  else {
    pid = fork();
    if (pid == -1) {
      outs2("warning: ");
      outs2("unable to fork for ");
      outs2(*service);
      outs2("/check: ");
      piVar2 = __errno_location();
      iVar1 = *piVar2;
    }
    else {
      if (pid == 0) {
        prog[0] = "./check";
        prog[1] = (char *)0x0;
        close(1);
        execve("check",prog,_environ);
        outs2("warning: ");
        outs2("unable to run ");
        outs2(*service);
        outs2("/check: ");
        piVar2 = __errno_location();
        pcVar3 = error_str(*piVar2);
        outs2(pcVar3);
        flush2("\n");
        _exit(0);
      }
      do {
        iVar1 = wait_pid((int *)prog,pid);
        if (iVar1 != -1) {
          return (uint)((uint)prog[0] < 0x100);
        }
        piVar2 = __errno_location();
      } while (*piVar2 == error_intr);
      outs2("warning: ");
      outs2("unable to wait for child ");
      outs2(*service);
      outs2("/check: ");
      iVar1 = *piVar2;
    }
  }
  pcVar3 = error_str(iVar1);
  outs2(pcVar3);
  flush2("\n");
  return 0;
}

Assistant:

int checkscript() {
  char *prog[2];
  struct stat s;
  int pid, w;

  if (stat("check", &s) == -1) {
    if (errno == error_noent) return(1);
    outs2(WARN); outs2("unable to stat "); outs2(*service); outs2("/check: ");
    outs2(error_str(errno)); flush2("\n");
    return(0);
  }
  /* if (!(s.st_mode & S_IXUSR)) return(1); */
  if ((pid =fork()) == -1) {
    outs2(WARN); outs2("unable to fork for "); outs2(*service);
    outs2("/check: "); outs2(error_str(errno)); flush2("\n");
    return(0);
  }
  if (!pid) {
    prog[0] ="./check";
    prog[1] =0;
    close(1);
    execve("check", prog, environ);
    outs2(WARN); outs2("unable to run "); outs2(*service); outs2("/check: ");
    outs2(error_str(errno)); flush2("\n");
    _exit(0);
  }
  while (wait_pid(&w, pid) == -1) {
    if (errno == error_intr) continue;
    outs2(WARN); outs2("unable to wait for child "); outs2(*service);
    outs2("/check: "); outs2(error_str(errno)); flush2("\n");
    return(0);
  }
  return(!wait_exitcode(w));
}